

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O2

int math_random(lua_State *L)

{
  double n;
  int iVar1;
  unsigned_long *state;
  unsigned_long n_00;
  lua_Integer lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  state = (unsigned_long *)lua_touserdata(L,-0xf4629);
  n_00 = nextrand(state);
  iVar1 = lua_gettop(L);
  if (iVar1 == 2) {
    lVar3 = luaL_checkinteger(L,1);
    lVar2 = luaL_checkinteger(L,2);
  }
  else {
    if (iVar1 != 1) {
      if (iVar1 != 0) {
        iVar1 = luaL_error(L,"wrong number of arguments");
        return iVar1;
      }
      n = (double)(n_00 >> 0xb) * 1.1102230246251565e-16;
      if (n < 1.0) {
        lua_pushnumber(L,n);
        return 1;
      }
      __assert_fail("0 <= res && res < 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lmathlib.c"
                    ,0x164,"lua_Number I2d(unsigned long)");
    }
    lVar2 = luaL_checkinteger(L,1);
    if (lVar2 == 0) goto LAB_00118c32;
    lVar3 = 1;
  }
  uVar5 = lVar2 - lVar3;
  if (lVar2 < lVar3) {
    luaL_argerror(L,1,"interval is empty");
  }
  if ((uVar5 + 1 & uVar5) == 0) {
    uVar6 = n_00 & uVar5;
  }
  else {
    uVar4 = uVar5 >> 1 | uVar5;
    uVar4 = uVar4 >> 2 | uVar4;
    uVar4 = uVar4 >> 4 | uVar4;
    uVar4 = uVar4 >> 8 | uVar4;
    uVar4 = uVar4 >> 0x10 | uVar4;
    uVar4 = uVar4 >> 0x20 | uVar4;
    if (((uVar5 <= uVar4 >> 1) || (uVar4 < uVar5)) || ((uVar4 + 1 & uVar4) != 0)) {
      __assert_fail("(lim & (lim + 1)) == 0 && lim >= n && (lim >> 1) < n",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lmathlib.c"
                    ,0x236,"lua_Unsigned project(lua_Unsigned, lua_Unsigned, RanState *)");
    }
    while (uVar6 = n_00 & uVar4, uVar5 < uVar6) {
      n_00 = nextrand(state);
    }
  }
  n_00 = uVar6 + lVar3;
LAB_00118c32:
  lua_pushinteger(L,n_00);
  return 1;
}

Assistant:

static int math_random (lua_State *L) {
  lua_Integer low, up;
  lua_Unsigned p;
  RanState *state = (RanState *)lua_touserdata(L, lua_upvalueindex(1));
  Rand64 rv = nextrand(state->s);  /* next pseudo-random value */
  switch (lua_gettop(L)) {  /* check number of arguments */
    case 0: {  /* no arguments */
      lua_pushnumber(L, I2d(rv));  /* float between 0 and 1 */
      return 1;
    }
    case 1: {  /* only upper limit */
      low = 1;
      up = luaL_checkinteger(L, 1);
      if (up == 0) {  /* single 0 as argument? */
        lua_pushinteger(L, I2UInt(rv));  /* full random integer */
        return 1;
      }
      break;
    }
    case 2: {  /* lower and upper limits */
      low = luaL_checkinteger(L, 1);
      up = luaL_checkinteger(L, 2);
      break;
    }
    default: return luaL_error(L, "wrong number of arguments");
  }
  /* random integer in the interval [low, up] */
  luaL_argcheck(L, low <= up, 1, "interval is empty");
  /* project random integer into the interval [0, up - low] */
  p = project(I2UInt(rv), (lua_Unsigned)up - (lua_Unsigned)low, state);
  lua_pushinteger(L, p + (lua_Unsigned)low);
  return 1;
}